

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O0

bool __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::flush
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this,
          bool destroy_queue)

{
  anon_class_24_3_a0dda7ee_for_cb cb_00;
  bool bVar1;
  byte bVar2;
  byte in_SIL;
  anon_class_8_1_7a75751d in_RDI;
  smallsizeclass_t sizeclass;
  bool posted;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  p;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *entry;
  size_t i;
  FreeListKey *key;
  anon_class_24_3_a0dda7ee_for_cb cb;
  size_t bytes_flushed;
  anon_class_8_1_7a75751d domesticate;
  LocalState *local_state;
  CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  cp;
  SlabMetadata *meta;
  Node *next;
  Node *curr;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *in_stack_fffffffffffffd48;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *in_stack_fffffffffffffd50;
  LocalEntropy *in_stack_fffffffffffffd60;
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *in_stack_fffffffffffffd68;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  RVar3;
  anon_class_8_1_7a75751d in_stack_fffffffffffffd70;
  Builder<false,_false,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *in_stack_fffffffffffffd78;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *this_00;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  in_stack_fffffffffffffd80;
  BackendSlabMetadata *in_stack_fffffffffffffd88;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *in_stack_fffffffffffffd98;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *pAVar4;
  Alloc<void> p_00;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_258;
  undefined8 in_stack_fffffffffffffdb0;
  ulong uVar5;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  size_t *in_stack_fffffffffffffdc0;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_230;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_228;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_220;
  ulong local_218;
  FreeListKey *local_210;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_200;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_1f8;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  *local_1f0;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  local_1e8;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_1e0;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_1d8;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  *local_1d0;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  local_1c8;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_1c0;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_1b8;
  byte local_1a9;
  LocalState *local_1a0;
  remove_const_t<stl::remove_reference_t<decltype(BuddyInplaceRep<bound<(Spatial)2,_(AddressSpaceControl)1,_(Wildness)1>_>::root)>_>
  in_stack_fffffffffffffe68;
  LocalState *in_stack_fffffffffffffe70;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  in_stack_fffffffffffffe78;
  undefined1 local_178 [8];
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_170;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  local_168;
  anon_class_1_0_00000001 local_149 [9];
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_140;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  local_138;
  Contents local_128;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  local_120;
  Contents local_118;
  Contents local_110;
  Contents local_108;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  local_f8;
  Contents local_e8;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  local_e0;
  Contents local_d8;
  Contents local_d0;
  Contents local_c8;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  local_c0;
  Contents local_b8;
  Contents local_b0;
  Contents local_a8;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  local_a0;
  Contents local_98;
  Contents local_90;
  Contents local_88;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  local_80;
  Contents local_70;
  Contents local_68;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  local_60;
  Contents local_58;
  remove_const_t<stl::remove_reference_t<decltype(BuddyInplaceRep<bound<(Spatial)2,_(AddressSpaceControl)1,_(Wildness)1>_>::root)>_>
  local_50;
  remove_const_t<stl::remove_reference_t<decltype(BuddyInplaceRep<bound<(Spatial)2,_(AddressSpaceControl)1,_(Wildness)1>_>::root)>_>
  local_48;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  local_40;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  local_38;
  Contents local_28;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  local_20;
  Contents local_10;
  Contents local_8;
  
  local_1a9 = in_SIL & 1;
  local_1c0 = (FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
               *)backend_state_ptr((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                                    *)in_RDI.local_state);
  local_1c8.root = 0;
  local_1b8 = local_1c0;
  if ((local_1a9 & 1) == 0) {
    while( true ) {
      message_queue((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                     *)0x1197e3);
      bVar1 = RemoteAllocator::can_dequeue((RemoteAllocator *)0x1197eb);
      if (!bVar1) break;
      pAVar4 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *
               )in_RDI.local_state;
      message_queue((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                     *)0x119820);
      bVar1 = RemoteAllocator::can_dequeue((RemoteAllocator *)0x119828);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
        handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::flush(bool)::_lambda()_1_>
                  ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                    *)in_RDI.local_state);
        in_stack_fffffffffffffd98 =
             (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
             in_RDI.local_state;
        in_RDI.local_state = (LocalState *)pAVar4;
      }
      else {
        flush::anon_class_1_0_00000001::operator()(local_149);
        in_stack_fffffffffffffd98 =
             (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
             in_RDI.local_state;
        in_RDI.local_state = (LocalState *)pAVar4;
      }
    }
  }
  else {
    local_1d0 = &local_1c8;
    local_1e0 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                 *)in_RDI.local_state;
    local_1d8 = local_1c0;
    message_queue((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                   *)0x119751);
    local_1e8.root =
         (remove_const_t<stl::remove_reference_t<decltype(BuddyChunkRep<BasicPagemap<PALLinux,_FlatPagemap<14UL,_DefaultPagemapEntryT<DefaultSlabMetadata<NoClientMetaDataProvider>_>,_PALLinux,_false>,_DefaultPagemapEntryT<DefaultSlabMetadata<NoClientMetaDataProvider>_>,_false>_>::root)>_>
          )local_1c0;
    local_200 = local_1e0;
    local_1f8 = local_1d8;
    local_1f0 = local_1d0;
    cb_00.domesticate.local_state._0_7_ = in_stack_fffffffffffffdb8;
    cb_00.this = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                  *)in_stack_fffffffffffffdb0;
    cb_00.domesticate.local_state._7_1_ = in_stack_fffffffffffffdbf;
    cb_00.bytes_flushed = in_stack_fffffffffffffdc0;
    in_stack_fffffffffffffd50 = local_1d8;
    RemoteAllocator::
    destroy_and_iterate<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::flush(bool)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::flush(bool)::_lambda(snmalloc::CapPtr<snmalloc::BatchedRemoteMessage,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>>)_1_>
              ((RemoteAllocator *)in_stack_fffffffffffffd98,in_RDI,cb_00);
    in_stack_fffffffffffffd48 = local_1e0;
  }
  local_210 = &freelist::Object::key_root;
  for (local_218 = 0; local_218 < 0x2b; local_218 = local_218 + 1) {
    bVar1 = freelist::
            Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
            ::empty((((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                       *)in_RDI.local_state)->super_FastFreeLists).small_fast_free_lists + local_218
                   );
    if (!bVar1) {
      local_228 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                   *)freelist::
                     Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                     ::peek((((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                               *)in_RDI.local_state)->super_FastFreeLists).small_fast_free_lists +
                            local_218);
      local_138.right.unsafe_capptr = &local_138;
      local_140 = local_228;
      local_138.left.unsafe_capptr = local_228;
      local_a8.unsafe_capptr = local_228;
      local_a0.root.unsafe_capptr =
           (remove_const_t<stl::remove_reference_t<decltype(BuddyInplaceRep<bound<(Spatial)2,_(AddressSpaceControl)1,_(Wildness)1>_>::root)>_>
            )(remove_const_t<stl::remove_reference_t<decltype(BuddyInplaceRep<bound<(Spatial)2,_(AddressSpaceControl)1,_(Wildness)1>_>::root)>_>
              )local_228;
      local_220 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                   *)FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
                     ::get<false>(in_stack_fffffffffffffd50,(address_t)in_stack_fffffffffffffd48);
      do {
        local_230 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                     *)freelist::
                       Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
                       ::
                       take<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::flush(bool)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_>
                                 (in_stack_fffffffffffffd68,(FreeListKey *)in_stack_fffffffffffffd60
                                  ,in_stack_fffffffffffffd70);
        local_1a0 = (LocalState *)&local_230;
        local_168.root =
             (remove_const_t<stl::remove_reference_t<decltype(BuddyChunkRep<BasicPagemap<PALLinux,_FlatPagemap<14UL,_DefaultPagemapEntryT<DefaultSlabMetadata<NoClientMetaDataProvider>_>,_PALLinux,_false>,_DefaultPagemapEntryT<DefaultSlabMetadata<NoClientMetaDataProvider>_>,_false>_>::root)>_>
              )local_178;
        local_108.unsafe_capptr = local_220;
        local_d0.unsafe_capptr = local_220;
        local_110.unsafe_capptr =
             (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)((((FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                    *)&local_220->left)->super_MetaEntryBase).meta & 0xfffffffffffffffe);
        local_98.unsafe_capptr = &local_f8;
        local_70.unsafe_capptr = &local_80;
        p_00.unsafe_capptr = in_RDI.local_state;
        in_stack_fffffffffffffe68.unsafe_capptr = local_230;
        in_stack_fffffffffffffe70 = local_1a0;
        in_stack_fffffffffffffe78.root =
             (remove_const_t<stl::remove_reference_t<decltype(BuddyChunkRep<BasicPagemap<PALLinux,_FlatPagemap<14UL,_DefaultPagemapEntryT<DefaultSlabMetadata<NoClientMetaDataProvider>_>,_PALLinux,_false>,_DefaultPagemapEntryT<DefaultSlabMetadata<NoClientMetaDataProvider>_>,_false>_>::root)>_>
              )local_230;
        local_170 = local_230;
        local_120.root.unsafe_capptr =
             (remove_const_t<stl::remove_reference_t<decltype(BuddyInplaceRep<bound<(Spatial)2,_(AddressSpaceControl)1,_(Wildness)1>_>::root)>_>
              )(remove_const_t<stl::remove_reference_t<decltype(BuddyInplaceRep<bound<(Spatial)2,_(AddressSpaceControl)1,_(Wildness)1>_>::root)>_>
                )local_230;
        local_118.unsafe_capptr = local_230;
        local_f8.left.unsafe_capptr = local_230;
        local_c8.unsafe_capptr = local_110.unsafe_capptr;
        local_c0.root.unsafe_capptr =
             (remove_const_t<stl::remove_reference_t<decltype(BuddyInplaceRep<bound<(Spatial)2,_(AddressSpaceControl)1,_(Wildness)1>_>::root)>_>
              )(remove_const_t<stl::remove_reference_t<decltype(BuddyInplaceRep<bound<(Spatial)2,_(AddressSpaceControl)1,_(Wildness)1>_>::root)>_>
                )local_110.unsafe_capptr;
        local_b8.unsafe_capptr = local_110.unsafe_capptr;
        local_b0.unsafe_capptr = local_110.unsafe_capptr;
        local_90.unsafe_capptr = local_230;
        local_88.unsafe_capptr = local_230;
        local_80.right.unsafe_capptr = local_230;
        freelist::
        Builder<false,_false,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
        ::add(in_stack_fffffffffffffd78,in_stack_fffffffffffffd80,
              (FreeListKey *)in_stack_fffffffffffffd70.local_state,
              (address_t)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        bVar1 = FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                ::return_object((FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                                 *)0x119b65);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_128.unsafe_capptr = local_f8.left.unsafe_capptr;
          dealloc_local_object_slow
                    (in_stack_fffffffffffffd98,p_00,(PagemapEntry *)in_RDI.local_state,
                     in_stack_fffffffffffffd88);
        }
        in_RDI.local_state = (LocalState *)p_00.unsafe_capptr;
        bVar1 = freelist::
                Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                ::empty((((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                           *)in_RDI.local_state)->super_FastFreeLists).small_fast_free_lists +
                        local_218);
      } while (((bVar1 ^ 0xffU) & 1) != 0);
    }
  }
  get_trunc_id((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *
               )0x119c06);
  bVar2 = RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
          ::post<9216ul>((RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                          *)in_stack_fffffffffffffe78.root,in_stack_fffffffffffffe70,
                         (alloc_id_t)in_stack_fffffffffffffe68.unsafe_capptr);
  for (uVar5 = 0; uVar5 < 0x2b; uVar5 = uVar5 + 1) {
    dealloc_local_slabs<true>
              ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *
               )in_stack_fffffffffffffd70.local_state,(smallsizeclass_t)in_stack_fffffffffffffd68);
  }
  this_00 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
             *)&((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                  *)in_RDI.local_state)->laden;
  local_258 = local_1c0;
  local_e0.root.unsafe_capptr =
       (remove_const_t<stl::remove_reference_t<decltype(BuddyInplaceRep<bound<(Spatial)2,_(AddressSpaceControl)1,_(Wildness)1>_>::root)>_>
        )&local_258;
  local_e8.unsafe_capptr =
       (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
        *)(((SeqSet<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *)this_00)->
          head).next;
  local_d8.unsafe_capptr = this_00;
  SeqSet<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>::Node::invariant
            ((Node *)local_e8.unsafe_capptr);
  while (local_e8.unsafe_capptr != this_00) {
    local_f8.right.unsafe_capptr = ((local_e8.unsafe_capptr)->left).unsafe_capptr;
    RVar3.root.unsafe_capptr = local_e0.root.unsafe_capptr;
    local_60.root.unsafe_capptr =
         (remove_const_t<stl::remove_reference_t<decltype(BuddyInplaceRep<bound<(Spatial)2,_(AddressSpaceControl)1,_(Wildness)1>_>::root)>_>
          )SeqSet<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>::containing
                     ((SeqSet<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *)
                      this_00,(Node *)local_e8.unsafe_capptr);
    local_58.unsafe_capptr =
         (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          *)RVar3.root.unsafe_capptr;
    bVar1 = FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
            ::is_large((FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                        *)local_60.root.unsafe_capptr);
    if (!bVar1) {
      local_28.unsafe_capptr =
           (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            *)((long)local_60.root.unsafe_capptr + 0x10);
      local_50 = local_60.root.unsafe_capptr;
      local_40.root.unsafe_capptr = local_60.root.unsafe_capptr;
      local_48 = local_60.root.unsafe_capptr;
      local_38.left.unsafe_capptr =
           (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            *)((ulong)local_60.root.unsafe_capptr >> 3);
      local_68.unsafe_capptr =
           (((FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)RVar3.root.unsafe_capptr)->left).unsafe_capptr;
      local_38.right.unsafe_capptr =
           (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            *)&freelist::Object::key_root;
      local_20.right.unsafe_capptr =
           (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            *)&freelist::Object::key_root;
      local_10.unsafe_capptr = &local_38;
      local_8.unsafe_capptr = &local_20;
      local_20.left.unsafe_capptr = local_68.unsafe_capptr;
    }
    local_e8.unsafe_capptr = local_f8.right.unsafe_capptr;
  }
  (((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
   in_RDI.local_state)->remote_dealloc_cache).capacity = 0;
  return (bool)(bVar2 & 1);
}

Assistant:

bool flush(bool destroy_queue = false)
    {
      auto local_state = backend_state_ptr();
      auto domesticate = [local_state](freelist::QueuePtr p)
                           SNMALLOC_FAST_PATH_LAMBDA {
                             return capptr_domesticate<Config>(local_state, p);
                           };

      size_t bytes_flushed = 0; // Not currently used.

      if (destroy_queue)
      {
        auto cb =
          [this, domesticate, &bytes_flushed](capptr::Alloc<RemoteMessage> m) {
            bool need_post = true; // Always going to post, so ignore.
            const PagemapEntry& entry =
              Config::Backend::get_metaentry(snmalloc::address_cast(m));
            handle_dealloc_remote(
              entry, m, need_post, domesticate, bytes_flushed);
          };

        message_queue().destroy_and_iterate(domesticate, cb);
      }
      else
      {
        // Process incoming message queue
        // Loop as normally only processes a batch
        while (has_messages())
          handle_message_queue([]() {});
      }

      auto& key = freelist::Object::key_root;

      for (size_t i = 0; i < NUM_SMALL_SIZECLASSES; i++)
      {
        if (small_fast_free_lists[i].empty())
          continue;

        // All elements should have the same entry.
        const auto& entry = Config::Backend::get_metaentry(
          address_cast(small_fast_free_lists[i].peek()));
        do
        {
          auto p = small_fast_free_lists[i].take(key, domesticate);
          SNMALLOC_ASSERT(is_start_of_object(
            sizeclass_t::from_small_class(i), address_cast(p)));
          dealloc_local_object(p.as_void(), entry);
        } while (!small_fast_free_lists[i].empty());
      }

      auto posted = remote_dealloc_cache.template post<sizeof(Allocator)>(
        local_state, get_trunc_id());

      // We may now have unused slabs, return to the global allocator.
      for (smallsizeclass_t sizeclass = 0; sizeclass < NUM_SMALL_SIZECLASSES;
           sizeclass++)
      {
        dealloc_local_slabs<true>(sizeclass);
      }

      laden.iterate(
        [domesticate](BackendSlabMetadata* meta) SNMALLOC_FAST_PATH_LAMBDA {
          if (!meta->is_large())
          {
            meta->free_queue.validate(
              freelist::Object::key_root, meta->as_key_tweak(), domesticate);
          }
        });

      // Set the remote_dealloc_cache to immediately slow path.
      remote_dealloc_cache.capacity = 0;

      return posted;
    }